

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O1

void __thiscall QSplashScreen::drawContents(QSplashScreen *this,QPainter *painter)

{
  long lVar1;
  QWidgetData *pQVar2;
  char cVar3;
  LayoutDirection LVar4;
  int iVar5;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QAnyStringView QVar6;
  QTextCursor cursor;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QPainter::setPen((QColor *)painter);
  pQVar2 = (this->super_QWidget).data;
  iStack_70 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + -5;
  iStack_6c = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + -5;
  local_78 = 5;
  iStack_74 = 5;
  QVar6.m_size = *(ulong *)(lVar1 + 0x280) | 0x8000000000000000;
  QVar6.field_0.m_data = ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(lVar1 + 0x278))->m_data;
  cVar3 = Qt::mightBeRichText(QVar6);
  if (cVar3 == '\0') {
    QPainter::drawText((QRect *)painter,(int)&local_78,(QString *)(ulong)*(uint *)(lVar1 + 0x298),
                       (QRect *)(lVar1 + 0x270));
    goto LAB_00489e31;
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::QTextDocument((QTextDocument *)&local_88,(QObject *)0x0);
  QTextDocument::setHtml((QString *)&local_88);
  QTextDocument::setTextWidth((double)((iStack_70 - local_78) + 1));
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_90,(QTextDocument *)&local_88);
  QTextCursor::select((SelectionType)(QTextCursor *)&local_90);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_68);
  ::QVariant::QVariant((QVariant *)&local_58,*(int *)(lVar1 + 0x298));
  iVar5 = (int)(QTextBlockFormat *)&local_68;
  QTextFormat::setProperty(iVar5,(QVariant *)0x1010);
  ::QVariant::~QVariant((QVariant *)&local_58);
  LVar4 = QWidget::layoutDirection(&this->super_QWidget);
  ::QVariant::QVariant((QVariant *)&local_58,LVar4);
  QTextFormat::setProperty(iVar5,(QVariant *)0x801);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QTextCursor::mergeBlockFormat((QTextBlockFormat *)&local_90);
  QTextDocument::size();
  if ((*(uint *)(lVar1 + 0x298) & 0x40) == 0) {
    if ((char)*(uint *)(lVar1 + 0x298) < '\0') {
      in_XMM1_Qa = in_XMM1_Qa * -0.5 +
                   (double)(((iStack_6c - iStack_74) - ((iStack_6c - iStack_74) + 1 >> 0x1f)) + 1 >>
                           1);
      goto LAB_00489dc2;
    }
  }
  else {
    in_XMM1_Qa = (double)((iStack_6c - iStack_74) + 1) - in_XMM1_Qa;
LAB_00489dc2:
    iStack_74 = (int)in_XMM1_Qa;
  }
  QPainter::save();
  local_58._8_4_ = SUB84((double)iStack_74,0);
  local_58._0_8_ = (double)local_78;
  local_58._12_4_ = (int)((ulong)(double)iStack_74 >> 0x20);
  QPainter::translate((QPointF *)painter);
  local_58._16_8_ = 0;
  uStack_40 = 0;
  local_58._0_16_ = ZEXT816(0);
  QTextDocument::drawContents((QPainter *)&local_88,(QRectF *)painter);
  QPainter::restore();
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  QTextCursor::~QTextCursor((QTextCursor *)&local_90);
  QTextDocument::~QTextDocument((QTextDocument *)&local_88);
LAB_00489e31:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplashScreen::drawContents(QPainter *painter)
{
    Q_D(QSplashScreen);
    painter->setPen(d->currColor);
    QRect r = rect().adjusted(5, 5, -5, -5);
    if (Qt::mightBeRichText(d->currStatus)) {
        QTextDocument doc;
#ifdef QT_NO_TEXTHTMLPARSER
        doc.setPlainText(d->currStatus);
#else
        doc.setHtml(d->currStatus);
#endif
        doc.setTextWidth(r.width());
        QTextCursor cursor(&doc);
        cursor.select(QTextCursor::Document);
        QTextBlockFormat fmt;
        fmt.setAlignment(Qt::Alignment(d->currAlign));
        fmt.setLayoutDirection(layoutDirection());
        cursor.mergeBlockFormat(fmt);
        const QSizeF txtSize = doc.size();
        if (d->currAlign & Qt::AlignBottom)
            r.setTop(r.height() - txtSize.height());
        else if (d->currAlign & Qt::AlignVCenter)
            r.setTop(r.height() / 2 - txtSize.height() / 2);
        painter->save();
        painter->translate(r.topLeft());
        doc.drawContents(painter);
        painter->restore();
    } else {
        painter->drawText(r, d->currAlign, d->currStatus);
    }
}